

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O1

char ** Dar_Permutations(int n)

{
  char **pRes;
  int iVar1;
  ulong uVar2;
  int nCols;
  bool bVar3;
  char Array [50];
  char local_58 [64];
  
  if (n < 1) {
    nCols = 1;
  }
  else {
    nCols = 1;
    iVar1 = 1;
    do {
      nCols = nCols * iVar1;
      bVar3 = iVar1 != n;
      iVar1 = iVar1 + 1;
    } while (bVar3);
  }
  pRes = Dar_ArrayAlloc(nCols,n,1);
  if (0 < n) {
    uVar2 = 0;
    do {
      local_58[uVar2] = (char)uVar2;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  Dar_Permutations_rec(pRes,nCols,n,local_58);
  return pRes;
}

Assistant:

char ** Dar_Permutations( int n )
{
    char Array[50];
    char ** pRes;
    int nFact, i;
    // allocate memory
    nFact = Dar_Factorial( n );
    pRes  = Dar_ArrayAlloc( nFact, n, sizeof(char) );
    // fill in the permutations
    for ( i = 0; i < n; i++ )
        Array[i] = i;
    Dar_Permutations_rec( pRes, nFact, n, Array );
    // print the permutations
/*
    {
    int i, k;
    for ( i = 0; i < nFact; i++ )
    {
        printf( "{" );
        for ( k = 0; k < n; k++ )
            printf( " %d", pRes[i][k] );
        printf( " }\n" );
    }
    }
*/
    return pRes;
}